

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

bool __thiscall CConsole::NextParam(CConsole *this,char *pNext,char **pFormat)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = *pFormat;
  if (*pcVar3 == '\0') {
    cVar1 = '\0';
  }
  else {
    pcVar4 = pcVar3 + 1;
    *pFormat = pcVar4;
    if (pcVar3[1] == '[') {
      iVar2 = str_span(pcVar4,"]");
      pcVar3 = *pFormat;
      pcVar4 = pcVar3 + iVar2;
      *pFormat = pcVar4;
      if (pcVar3[iVar2] == '\0') {
        return true;
      }
      pcVar4 = pcVar4 + 1;
      *pFormat = pcVar4;
    }
    pcVar3 = str_skip_whitespaces_const(pcVar4);
    *pFormat = pcVar3;
    cVar1 = *pcVar3;
  }
  *pNext = cVar1;
  return false;
}

Assistant:

bool CConsole::NextParam(char *pNext, const char *&pFormat)
{
	if(*pFormat)
	{
		pFormat++;

		if(*pFormat == '[')
		{
			// skip bracket contents
			pFormat += str_span(pFormat, "]");
			if(!*pFormat)
				return true;

			// skip ']'
			pFormat++;
		}

		// skip space if there is one
		pFormat = str_skip_whitespaces_const(pFormat);
	}
	*pNext = *pFormat;
	return false;
}